

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O1

CServerFilter * __thiscall
CServerBrowserFilter::CServerFilter::operator=(CServerFilter *this,CServerFilter *Other)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  if (Other != this) {
    this->m_pServerBrowserFilter = Other->m_pServerBrowserFilter;
    CServerFilterInfo::Set(&this->m_FilterInfo,&Other->m_FilterInfo);
    iVar2 = Other->m_NumSortedServers;
    this->m_NumSortedPlayers = Other->m_NumSortedPlayers;
    this->m_NumSortedServers = iVar2;
    this->m_SortedServersCapacity = Other->m_SortedServersCapacity;
    if (this->m_pSortedServerlist != (int *)0x0) {
      mem_free(this->m_pSortedServerlist);
    }
    piVar3 = (int *)mem_alloc(this->m_SortedServersCapacity << 2);
    this->m_pSortedServerlist = piVar3;
    if (0 < this->m_SortedServersCapacity) {
      piVar1 = Other->m_pSortedServerlist;
      lVar4 = 0;
      do {
        piVar3[lVar4] = piVar1[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->m_SortedServersCapacity);
    }
  }
  return this;
}

Assistant:

CServerBrowserFilter::CServerFilter& CServerBrowserFilter::CServerFilter::operator=(const CServerBrowserFilter::CServerFilter& Other)
{
	if(&Other != this)
	{
		m_pServerBrowserFilter = Other.m_pServerBrowserFilter;
		m_FilterInfo.Set(&Other.m_FilterInfo);
		m_NumSortedPlayers = Other.m_NumSortedPlayers;
		m_NumSortedServers = Other.m_NumSortedServers;
		m_SortedServersCapacity = Other.m_SortedServersCapacity;

		if(m_pSortedServerlist)
			mem_free(m_pSortedServerlist);
		m_pSortedServerlist = (int *)mem_alloc(m_SortedServersCapacity * sizeof(int));
		for(int i = 0; i < m_SortedServersCapacity; ++i)
			m_pSortedServerlist[i] = Other.m_pSortedServerlist[i];
	}
	return *this;
}